

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_bintree(int scope,int *Root,int *Up,int *Left,int *Right)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  int *in_R8;
  int nproc;
  int index;
  int right;
  int left;
  int up;
  int root;
  int local_38;
  int local_34;
  int local_30;
  
  if (in_EDI == 0x151) {
    __assert_fail("SCOPE_NODE != scope",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x223,"void armci_msg_bintree(int, int *, int *, int *, int *)");
  }
  if (in_EDI != 0x153) {
    iVar1 = armci_msg_nproc();
    iVar2 = armci_msg_me();
    local_30 = (iVar2 + -1) / 2;
    if (local_30 < 0) {
      local_30 = -1;
    }
    local_34 = iVar2 * 2 + 1;
    if (iVar1 <= local_34) {
      local_34 = -1;
    }
    local_38 = iVar2 * 2 + 2;
    if (iVar1 <= local_38) {
      local_38 = -1;
    }
    *in_RDX = local_30;
    *in_RCX = local_34;
    *in_R8 = local_38;
    *in_RSI = 0;
    return;
  }
  __assert_fail("SCOPE_MASTERS != scope",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x224,"void armci_msg_bintree(int, int *, int *, int *, int *)");
}

Assistant:

void armci_msg_bintree(int scope, int* Root, int *Up, int *Left, int *Right)
{
    int root, up, left, right, index, nproc;

    assert(SCOPE_NODE != scope);
    assert(SCOPE_MASTERS != scope);

    root  = 0;
    nproc = armci_msg_nproc();
    index = armci_msg_me() - root;
    up    = (index-1)/2 + root; if( up < root) up = -1;
    left  = 2*index + 1 + root; if(left >= root+nproc) left = -1;
    right = 2*index + 2 + root; if(right >= root+nproc)right = -1;

    *Up = up;
    *Left = left;
    *Right = right;
    *Root = root;
}